

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_SourceCodeOperations.cpp
# Opt level: O0

void __thiscall
soul::SourceCodeOperations::replaceText
          (SourceCodeOperations *this,CodeLocation *start,CodeLocation *end,string *newText)

{
  bool condition;
  TextModificationOp local_68;
  size_t local_38;
  size_t e;
  size_t s;
  string *newText_local;
  CodeLocation *end_local;
  CodeLocation *start_local;
  SourceCodeOperations *this_local;
  
  s = (size_t)newText;
  newText_local = (string *)end;
  end_local = start;
  start_local = &this->source;
  e = CodeLocation::getByteOffsetInFile(start);
  local_38 = CodeLocation::getByteOffsetInFile(end);
  checkAssertion(e <= local_38,"e >= s","replaceText",0x8f);
  condition = std::operator!=(&this->applyModification,(nullptr_t)0x0);
  checkAssertion(condition,"applyModification != nullptr","replaceText",0x90);
  local_68.startOffset = e;
  local_68.length = local_38 - e;
  std::__cxx11::string::string((string *)&local_68.insertedText,(string *)newText);
  std::function<void_(const_soul::SourceCodeOperations::TextModificationOp_&)>::operator()
            (&this->applyModification,&local_68);
  TextModificationOp::~TextModificationOp(&local_68);
  return;
}

Assistant:

void SourceCodeOperations::replaceText (CodeLocation start, CodeLocation end, std::string newText)
{
    auto s = start.getByteOffsetInFile();
    auto e = end.getByteOffsetInFile();
    SOUL_ASSERT (e >= s);
    SOUL_ASSERT (applyModification != nullptr);
    applyModification ({ s, e - s, std::move (newText) });
}